

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_migrate.cpp
# Opt level: O2

Remotes * Omega_h::form_down_use_owners
                    (Remotes *__return_storage_ptr__,Mesh *mesh,Int high_dim,Int low_dim)

{
  LOs uses2lows;
  Remotes lows2owners;
  Write<int> WStack_88;
  Write<int> local_78;
  Adj local_68;
  Remotes local_38;
  
  Mesh::ask_down(&local_68,mesh,high_dim,low_dim);
  Write<int>::Write(&local_78,&local_68.super_Graph.ab2b.write_);
  Adj::~Adj(&local_68);
  Mesh::ask_owners((Remotes *)&local_68,mesh,low_dim);
  Write<int>::Write(&WStack_88,&local_78);
  Remotes::Remotes(&local_38,(Remotes *)&local_68);
  unmap(__return_storage_ptr__,(LOs *)&WStack_88,&local_38);
  Remotes::~Remotes(&local_38);
  Write<int>::~Write(&WStack_88);
  Remotes::~Remotes((Remotes *)&local_68);
  Write<int>::~Write(&local_78);
  return __return_storage_ptr__;
}

Assistant:

Remotes form_down_use_owners(Mesh* mesh, Int high_dim, Int low_dim) {
  auto uses2lows = mesh->ask_down(high_dim, low_dim).ab2b;
  auto lows2owners = mesh->ask_owners(low_dim);
  return unmap(uses2lows, lows2owners);
}